

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcs.cc
# Opt level: O0

int __thiscall dcs::Header::readFrom(Header *this,char *buf,size_t len)

{
  int iVar1;
  runtime_error *prVar2;
  char *pcVar3;
  time_t tVar4;
  ulong uVar5;
  long lVar6;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint n_10;
  uint n_9;
  uint n_8;
  uint n_7;
  uint n_6;
  uint n_5;
  uint n_4;
  uint n_3;
  uint n_2;
  tm tm;
  int second;
  int minute;
  int hour;
  int day;
  int year;
  uint n_1;
  int rv;
  uint n;
  size_t nread;
  size_t *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  allocator local_3f9;
  string local_3f8 [35];
  undefined1 local_3d5;
  undefined4 local_3d4;
  string local_3d0 [32];
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  char (*in_stack_fffffffffffffc60) [85];
  char (*in_stack_fffffffffffffc68) [42];
  string local_370 [32];
  undefined4 local_350;
  allocator local_349;
  string local_348 [35];
  undefined1 local_325;
  undefined4 local_324;
  string local_320 [36];
  undefined4 local_2fc;
  undefined1 local_2f5;
  undefined4 local_2f4;
  string local_2f0 [36];
  undefined4 local_2cc;
  undefined1 local_2c5;
  undefined4 local_2c4;
  string local_2c0 [32];
  undefined4 local_2a0;
  allocator local_299;
  string local_298 [35];
  undefined1 local_275;
  undefined4 local_274;
  string local_270 [32];
  undefined4 local_250;
  allocator local_249;
  string local_248 [35];
  undefined1 local_225;
  undefined4 local_224;
  string local_220 [36];
  undefined4 local_1fc;
  undefined1 local_1f5;
  undefined4 local_1f4;
  string local_1f0 [36];
  undefined4 local_1cc;
  tm local_1c8;
  allocator local_189;
  string local_188 [32];
  int local_168;
  allocator local_161;
  string local_160 [32];
  int local_140;
  allocator local_139;
  string local_138 [32];
  int local_118;
  allocator local_111;
  string local_110 [32];
  int local_f0;
  allocator local_e9;
  string local_e8 [36];
  int local_c4;
  undefined1 local_bd;
  undefined4 local_bc;
  string local_b8 [36];
  undefined4 local_94;
  undefined1 local_8d;
  undefined4 local_8c;
  string local_88 [36];
  int local_64;
  undefined1 local_5d;
  undefined4 local_4c;
  string local_48 [36];
  undefined4 local_24;
  ulong local_20;
  ulong local_18;
  long local_10;
  
  local_20 = 0;
  local_24 = 8;
  if (in_RDX < 8) {
    local_5d = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_4c = 0x37;
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_48);
    local_5d = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_64 = __isoc99_sscanf(in_RSI,"%08lx",in_RDI);
  if (local_64 != 1) {
    local_8d = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_8c = 0x39;
    util::str<char[31],char[85],char[2],int>
              ((char (*) [31])in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_88);
    local_8d = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_20 = local_20 + 8;
  local_94 = 0xb;
  if (local_18 - local_20 < 0xb) {
    local_bd = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_bc = 0x41;
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_b8);
    local_bd = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = (char *)(local_10 + local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,pcVar3,2,&local_e9);
  iVar1 = std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                             ,in_stack_fffffffffffffab8,0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_20 = local_20 + 2;
  pcVar3 = (char *)(local_10 + local_20);
  local_c4 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,pcVar3,3,&local_111);
  iVar1 = std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                             ,in_stack_fffffffffffffab8,0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  local_20 = local_20 + 3;
  pcVar3 = (char *)(local_10 + local_20);
  local_f0 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,pcVar3,2,&local_139);
  iVar1 = std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                             ,in_stack_fffffffffffffab8,0);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  local_20 = local_20 + 2;
  pcVar3 = (char *)(local_10 + local_20);
  local_118 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,pcVar3,2,&local_161);
  iVar1 = std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                             ,in_stack_fffffffffffffab8,0);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_20 = local_20 + 2;
  pcVar3 = (char *)(local_10 + local_20);
  local_140 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,pcVar3,2,&local_189);
  iVar1 = std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                             ,in_stack_fffffffffffffab8,0);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  local_20 = local_20 + 2;
  local_168 = iVar1;
  memset(&local_1c8,0,0x38);
  local_1c8.tm_year = local_c4 + 100;
  tVar4 = mktime(&local_1c8);
  *(time_t *)(in_RDI + 8) =
       tVar4 + ((local_f0 * 0x18 + local_118) * 0x3c + local_140) * 0x3c + (long)local_168;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  local_1cc = 1;
  if (local_18 == local_20) {
    local_1f5 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1f4 = 0x5b;
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_1f0);
    local_1f5 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined1 *)(in_RDI + 0x18) = *(undefined1 *)(local_10 + local_20);
  local_20 = local_20 + 1;
  local_1fc = 2;
  if (local_18 - local_20 < 2) {
    local_225 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_224 = 99;
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_220);
    local_225 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = (char *)(local_10 + local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,pcVar3,2,&local_249);
  iVar1 = std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                             ,in_stack_fffffffffffffab8,0);
  *(int *)(in_RDI + 0x1c) = iVar1;
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  local_20 = local_20 + 2;
  local_250 = 2;
  if (local_18 - local_20 < 2) {
    local_275 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_274 = 0x6b;
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_270);
    local_275 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((*(char *)(local_10 + local_20) == '+') || (*(char *)(local_10 + local_20) == '-')) &&
     (*(char *)(local_10 + 1 + local_20) == 'A')) {
    *(undefined4 *)(in_RDI + 0x20) = 0;
  }
  else {
    pcVar3 = (char *)(local_10 + local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,pcVar3,2,&local_299);
    iVar1 = std::__cxx11::stoi((string *)
                               CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                               in_stack_fffffffffffffab8,0);
    *(int *)(in_RDI + 0x20) = iVar1;
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
  }
  uVar5 = local_20 + 2;
  local_2a0 = 1;
  if (local_18 == uVar5) {
    local_2c5 = 1;
    local_20 = uVar5;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_2c4 = 0x78;
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_2c0);
    local_2c5 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined1 *)(in_RDI + 0x24) = *(undefined1 *)(local_10 + uVar5);
  uVar5 = local_20 + 3;
  local_2cc = 1;
  if (local_18 == uVar5) {
    local_2f5 = 1;
    local_20 = uVar5;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_2f4 = 0x80;
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_2f0);
    local_2f5 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined1 *)(in_RDI + 0x25) = *(undefined1 *)(local_10 + uVar5);
  local_20 = local_20 + 4;
  local_2fc = 3;
  if (local_18 - local_20 < 3) {
    local_325 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_324 = 0x88;
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_320);
    local_325 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = (char *)(local_10 + local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,pcVar3,3,&local_349);
  iVar1 = std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                             ,in_stack_fffffffffffffab8,0);
  *(int *)(in_RDI + 0x28) = iVar1;
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  uVar5 = local_20 + 3;
  local_350 = 1;
  if (local_18 == uVar5) {
    local_20 = uVar5;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_370);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined1 *)(in_RDI + 0x2c) = *(undefined1 *)(local_10 + uVar5);
  lVar6 = local_20 + 4;
  if (local_18 - lVar6 < 2) {
    uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffc58);
    local_20 = lVar6;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(0x98,uVar7),
               (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,(string *)&stack0xfffffffffffffc60);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined2 *)(in_RDI + 0x2d) = *(undefined2 *)(local_10 + lVar6);
  local_20 = local_20 + 6;
  uVar7 = 5;
  if (local_18 - local_20 < 5) {
    local_3d5 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_3d4 = 0xa0;
    util::str<char[42],char[85],char[2],int>
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int *)CONCAT44(uVar7,in_stack_fffffffffffffc50));
    std::runtime_error::runtime_error(prVar2,local_3d0);
    local_3d5 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = (char *)(local_10 + local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,pcVar3,5,&local_3f9);
  iVar1 = std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0)
                             ,in_stack_fffffffffffffab8,0);
  *(int *)(in_RDI + 0x30) = iVar1;
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  return (int)local_20 + 5;
}

Assistant:

int Header::readFrom(const char* buf, size_t len) {
  size_t nread = 0;

  // 8 hex digit DCP Address
  {
    constexpr unsigned n = 8;
    ASSERT((len - nread) >= 8);
    auto rv = sscanf(buf + nread, "%08lx", &address);
    ASSERT(rv == 1);
    nread += n;
  }

  // YYDDDHHMMSS – Time the message arrived at the Wallops receive station.
  // The day is represented as a three digit day of the year (julian day).
  {
    constexpr unsigned n = 11;
    ASSERT((len - nread) >= n);
    auto year = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;
    auto day = std::stoi(std::string(buf + nread, 3), nullptr, 10);
    nread += 3;
    auto hour = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;
    auto minute = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;
    auto second = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;

    struct tm tm;
    memset(&tm, 0, sizeof(tm));

    // The number of years since 1900.
    tm.tm_year = 100 + year;

    // Use offset at beginning of year and add parts
    time.tv_sec = mktime(&tm) + ((((day * 24) + hour) * 60) + minute) * 60 + second;
    time.tv_nsec = 0;
  }

  // 1 character failure code
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    failure = buf[nread];
    nread += n;
  }

  // 2 decimal digit signal strength
  {
    constexpr unsigned n = 2;
    ASSERT((len - nread) >= n);
    signalStrength = std::stoi(std::string(buf + nread, 2));
    nread += n;
  }

  // 2 decimal digit frequency offset
  {
    constexpr unsigned n = 2;
    ASSERT((len - nread) >= n);
    // This can be +A or -A; don't know what it means...
    if ((buf[nread] == '+' || buf[nread] == '-') && buf[nread+1] == 'A') {
      frequencyOffset = 0;
    } else {
      frequencyOffset = std::stoi(std::string(buf + nread, n));
    }
    nread += n;
  }

  // 1 character modulation index
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    modulationIndex = buf[nread];
    nread += n;
  }

  // 1 character data quality indicator
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    dataQuality = buf[nread];
    nread += n;
  }

  // 3 decimal digit GOES receive channel
  {
    constexpr unsigned n = 3;
    ASSERT((len - nread) >= n);
    receiveChannel = std::stoi(std::string(buf + nread, n));
    nread += n;
  }

  // 1 character GOES spacecraft indicator ('E' or 'W')
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    spacecraft = buf[nread];
    nread += n;
  }

  // 2 character data source code Data Source Code Table
  {
    constexpr unsigned n = 2;
    ASSERT((len - nread) >= n);
    memcpy(dataSourceCode, buf + nread, n);
    nread += n;
  }

  // 5 decimal digit message data length
  {
    constexpr unsigned n = 5;
    ASSERT((len - nread) >= n);
    dataLength = std::stoi(std::string(buf + nread, n));
    nread += n;
  }

  return nread;
}